

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_scrypt_smix_sse2.c
# Opt level: O2

void sse2_blkxor(void *dest,void *src,size_t len)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar11 = len >> 4;
  lVar10 = 0;
  while (bVar12 = uVar11 != 0, uVar11 = uVar11 - 1, bVar12) {
    puVar1 = (uint *)((long)src + lVar10);
    uVar4 = puVar1[1];
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    puVar2 = (uint *)((long)dest + lVar10);
    uVar7 = puVar2[1];
    uVar8 = puVar2[2];
    uVar9 = puVar2[3];
    puVar3 = (uint *)((long)dest + lVar10);
    *puVar3 = *puVar1 ^ *puVar2;
    puVar3[1] = uVar4 ^ uVar7;
    puVar3[2] = uVar5 ^ uVar8;
    puVar3[3] = uVar6 ^ uVar9;
    lVar10 = lVar10 + 0x10;
  }
  return;
}

Assistant:

static void
sse2_blkxor(void * dest, const void * src, size_t len)
{
	__m128i * D = dest;
	const __m128i * S = src;
	size_t L = len / 16;
	size_t i;

	for (i = 0; i < L; i++)
		D[i] = _mm_xor_si128(D[i], S[i]);
}